

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestUint32Conversions(void)

{
  uint32_t max_float32;
  char *unaff_retaddr;
  uint32_t min_float32;
  char *in_stack_00000010;
  uint32_t ordered;
  Single in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar1;
  Single in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar2;
  Single in_stack_fffffffffffffff8;
  undefined4 uVar3;
  
  uVar3 = 0x1234567;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffff8,0x1234567);
  double_conversion::Single::value((Single *)0x86ae64);
  CheckEqualsHelper(in_stack_00000010,min_float32,unaff_retaddr,
                    (double)CONCAT44(uVar3,in_stack_fffffffffffffff8.d32_),
                    (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0.d32_),
                    (double)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8.d32_));
  uVar2 = 1;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffff0,1);
  double_conversion::Single::value((Single *)0x86aeaf);
  CheckEqualsHelper(in_stack_00000010,min_float32,unaff_retaddr,
                    (double)CONCAT44(uVar3,in_stack_fffffffffffffff8.d32_),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0.d32_),
                    (double)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8.d32_));
  uVar1 = 0x7f7fffff;
  double_conversion::Single::Single((Single *)&stack0xffffffffffffffe8,0x7f7fffff);
  double_conversion::Single::value((Single *)0x86aef6);
  CheckEqualsHelper(in_stack_00000010,min_float32,unaff_retaddr,
                    (double)CONCAT44(uVar3,in_stack_fffffffffffffff8.d32_),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0.d32_),
                    (double)CONCAT44(uVar1,in_stack_ffffffffffffffe8.d32_));
  return;
}

Assistant:

TEST(Uint32Conversions) {
  // Start by checking the byte-order.
  uint32_t ordered = 0x01234567;
  CHECK_EQ(2.9988165487136453e-38f, Single(ordered).value());

  uint32_t min_float32 = 0x00000001;
  CHECK_EQ(1.4e-45f, Single(min_float32).value());

  uint32_t max_float32 = 0x7f7fffff;
  CHECK_EQ(3.4028234e38f, Single(max_float32).value());
}